

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRConsoleNode.cpp
# Opt level: O1

void __thiscall
MinVR::VRConsoleNode::render
          (VRConsoleNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  string local_60;
  string local_40;
  
  VRDataIndex::pushState(renderState);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/IsConsole","");
  VRDataIndex::addData(&local_40,renderState,&local_60,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  (*renderHandler->_vptr_VRRenderHandler[1])(renderHandler,renderState);
  (**renderHandler->_vptr_VRRenderHandler)(renderHandler,renderState);
  VRDataIndex::popState(renderState);
  return;
}

Assistant:

void VRConsoleNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {

  renderState->pushState();
	renderState->addData("/IsConsole", 1);

	renderHandler->onVRRenderContext(*renderState);
	renderHandler->onVRRenderScene(*renderState);

   renderState->popState();
}